

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall RCONConsoleCommand::trigger(RCONConsoleCommand *this,string_view parameters)

{
  ostream *poVar1;
  const_iterator __begin1;
  undefined8 *puVar2;
  undefined8 *local_38;
  undefined8 *local_30;
  
  if (parameters._M_len == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Error: Too Few Parameters. Syntax: rcon <input>"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  RenX::getCore();
  RenX::Core::getServers();
  puVar2 = local_38;
  if (local_38 == local_30) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Error: Not connected to any Renegade X servers."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    for (; puVar2 != local_30; puVar2 = puVar2 + 1) {
      RenX::Server::send(*puVar2,parameters._M_len,parameters._M_str);
    }
  }
  std::_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~_Vector_base
            ((_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&local_38);
  return;
}

Assistant:

void RCONConsoleCommand::trigger(std::string_view parameters) {
	if (parameters.empty()) {
		std::cout << "Error: Too Few Parameters. Syntax: rcon <input>" << std::endl;
	}

	const auto& servers = RenX::getCore()->getServers();
	if (servers.empty()) {
		std::cout << "Error: Not connected to any Renegade X servers." << std::endl;
		return;
	}

	for (const auto& server : servers) {
		server->send(parameters);
	}
}